

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GamepadInputHandler_glfw.cpp
# Opt level: O0

void __thiscall GamepadInputHandler::added(GamepadInputHandler *this,GLFWwindow *window)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  allocator local_39;
  string local_38 [32];
  GLFWwindow *local_18;
  GLFWwindow *window_local;
  GamepadInputHandler *this_local;
  
  local_18 = window;
  window_local = (GLFWwindow *)this;
  iVar2 = glfwJoystickPresent((uint)this->_gamepadIndex);
  if (iVar2 == 0) {
    printf("GLFW joystick number %u doesn\'t exist!",(ulong)this->_gamepadIndex);
    puts("");
    fflush(_stdout);
  }
  else {
    iVar2 = glfwJoystickIsGamepad((uint)this->_gamepadIndex);
    if (iVar2 == 0) {
      printf("GLFW joystick number %u isn\'t a gamepad!",(ulong)this->_gamepadIndex);
      puts("");
      fflush(_stdout);
    }
    else {
      pcVar3 = glfwGetGamepadName((uint)this->_gamepadIndex);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,pcVar3,&local_39);
      std::__cxx11::string::operator=((string *)&this->_gamepadName,local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      bVar1 = this->_gamepadIndex;
      uVar4 = std::__cxx11::string::c_str();
      printf("Gamepad added: %u - %s",(ulong)bVar1,uVar4);
      puts("");
      fflush(_stdout);
    }
  }
  return;
}

Assistant:

void GamepadInputHandler::added(GLFWwindow *window) {
    // Check if the gamepad exists
    if (!glfwJoystickPresent(_gamepadIndex)) {
        DEBUG_PRINTLN("GLFW joystick number %u doesn't exist!", _gamepadIndex);
        return;
    }

    // Make sure it's actually a gamepad
    if(!glfwJoystickIsGamepad(_gamepadIndex)) {
        DEBUG_PRINTLN("GLFW joystick number %u isn't a gamepad!", _gamepadIndex);
        return;
    }

    // Print the gamepad name
    _gamepadName = std::string(glfwGetGamepadName(_gamepadIndex));
    DEBUG_PRINTLN("Gamepad added: %u - %s", _gamepadIndex, _gamepadName.c_str());
}